

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O3

vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> * __thiscall
QPDFAcroFormDocumentHelper::getFormFields
          (vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>
           *__return_storage_ptr__,QPDFAcroFormDocumentHelper *this)

{
  element_type *peVar1;
  _Rb_tree_node_base *p_Var2;
  QPDFObjectHandle QStack_38;
  
  analyze(this);
  (__return_storage_ptr__->
  super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar1 = (this->m).
           super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  for (p_Var2 = *(_Base_ptr *)
                 ((long)&(peVar1->field_to_annotations)._M_t._M_impl.super__Rb_tree_header._M_header
                 + 0x10);
      (_Rb_tree_header *)p_Var2 !=
      &(peVar1->field_to_annotations)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    QPDF::getObject((QPDF *)&QStack_38,(QPDFObjGen)(this->super_QPDFDocumentHelper).qpdf);
    std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::
    emplace_back<QPDFObjectHandle>(__return_storage_ptr__,&QStack_38);
    if (QStack_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (QStack_38.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFFormFieldObjectHelper>
QPDFAcroFormDocumentHelper::getFormFields()
{
    analyze();
    std::vector<QPDFFormFieldObjectHelper> result;
    for (auto const& iter: m->field_to_annotations) {
        result.emplace_back(qpdf.getObject(iter.first));
    }
    return result;
}